

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O2

bool MeCab::Viterbi::buildAllLattice(Lattice *lattice)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long pos;
  long lVar5;
  long *plVar6;
  undefined4 extraout_var;
  
  iVar2 = (*lattice->_vptr_Lattice[0x12])(lattice,0x20);
  if ((char)iVar2 != '\0') {
    iVar2 = (*lattice->_vptr_Lattice[2])(lattice);
    plVar4 = (long *)CONCAT44(extraout_var,iVar2);
    iVar2 = (*lattice->_vptr_Lattice[0xb])(lattice);
    iVar3 = (*lattice->_vptr_Lattice[4])(lattice);
    for (lVar5 = 0; lVar5 <= CONCAT44(extraout_var_00,iVar2); lVar5 = lVar5 + 1) {
      plVar6 = (long *)(CONCAT44(extraout_var_01,iVar3) + lVar5 * 8);
      while (plVar1 = (long *)*plVar6, plVar1 != (long *)0x0) {
        plVar4[1] = (long)plVar1;
        *plVar1 = (long)plVar4;
        plVar4 = plVar1;
        plVar6 = plVar1 + 3;
      }
    }
  }
  return true;
}

Assistant:

bool Viterbi::buildAllLattice(Lattice *lattice) {
  if (!lattice->has_request_type(MECAB_ALL_MORPHS)) {
    return true;
  }

  Node *prev = lattice->bos_node();
  const size_t len = lattice->size();
  Node **begin_node_list = lattice->begin_nodes();

  for (long pos = 0; pos <= static_cast<long>(len); ++pos) {
    for (Node *node = begin_node_list[pos]; node; node = node->bnext) {
      prev->next = node;
      node->prev = prev;
      prev = node;
    }
  }

  return true;
}